

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O2

void Bmc_ComputeSimTest(Gia_Man_t *p)

{
  Vec_Wrd_t **p_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Wrd_t *pVVar4;
  word *__s;
  int iVar5;
  long lVar6;
  int (*paiVar7) [2];
  int *piVar8;
  int (*paiVar9) [64];
  int (*paiVar10) [64];
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  int (*paaiVar16) [2] [2];
  int DiffCount [64];
  int PatCount [64] [2] [2];
  int Count [2] [64] [64];
  
  memset(Count,0,0x8000);
  memset(PatCount,0,0x400);
  memset(DiffCount,0,0x100);
  p_01 = Vec_IntAlloc(p->vCis->nSize);
  p_02 = Vec_IntAlloc(p->vCis->nSize);
  p_00 = &p->vSims;
  Vec_WrdFreeP(p_00);
  iVar1 = p->nObjs;
  pVVar4 = (Vec_Wrd_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  pVVar4->nCap = iVar5;
  if (iVar5 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar5 << 3);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = iVar1;
  memset(__s,0,(long)iVar1 << 3);
  *p_00 = pVVar4;
  printf("Number of patterns = %d.\n",0x100);
  for (iVar1 = 0; iVar1 != 0x100; iVar1 = iVar1 + 1) {
    p_01->nSize = 0;
    for (iVar5 = 0; iVar5 < p->vCis->nSize; iVar5 = iVar5 + 1) {
      uVar2 = rand();
      Vec_IntPush(p_01,uVar2 & 1);
    }
    uVar3 = Bmc_ComputeSimDiff(p,p_01,p_02);
    uVar2 = p_01->nSize;
    if (p_01->nSize < 1) {
      uVar2 = 0;
    }
    paiVar7 = PatCount[0] + uVar3;
    for (uVar14 = 0; uVar2 != uVar14; uVar14 = uVar14 + 1) {
      iVar5 = Vec_IntEntry(p_01,(int)uVar14);
      (*paiVar7)[iVar5] = (*paiVar7)[iVar5] + 1;
      paiVar7 = paiVar7 + 2;
    }
    uVar2 = p_02->nSize;
    uVar14 = 0;
    if (0 < (int)uVar2) {
      uVar14 = (ulong)uVar2;
    }
    piVar8 = (int *)(Count + uVar3);
    for (uVar15 = 0; uVar15 != uVar14; uVar15 = uVar15 + 1) {
      iVar5 = Vec_IntEntry(p_02,(int)uVar15);
      if (iVar5 != 0) {
        DiffCount[uVar15] = DiffCount[uVar15] + 1;
      }
      for (lVar6 = 1; iVar11 = (int)uVar15 + (int)lVar6, iVar11 < (int)uVar2; lVar6 = lVar6 + 1) {
        iVar11 = Vec_IntEntry(p_02,iVar11);
        if ((iVar5 != 0) && (iVar11 != 0)) {
          piVar8[lVar6] = piVar8[lVar6] + 1;
        }
      }
      piVar8 = piVar8 + 0x41;
    }
  }
  Vec_IntFree(p_01);
  Vec_IntFree(p_02);
  Vec_WrdFreeP(p_00);
  putchar(10);
  printf("      ");
  paaiVar16 = PatCount;
  for (iVar1 = 0; iVar1 < p->vCis->nSize; iVar1 = iVar1 + 1) {
    printf("%3c ",(ulong)(iVar1 + 0x61));
  }
  putchar(10);
  printf("Off0  ");
  for (lVar6 = 0; lVar6 < p->vCis->nSize; lVar6 = lVar6 + 1) {
    printf("%3d ",(ulong)(uint)(*paaiVar16)[0][0]);
    paaiVar16 = paaiVar16 + 1;
  }
  putchar(10);
  printf("Off1  ");
  piVar8 = PatCount[0][0] + 1;
  for (lVar6 = 0; lVar6 < p->vCis->nSize; lVar6 = lVar6 + 1) {
    printf("%3d ",(ulong)(uint)*piVar8);
    piVar8 = piVar8 + 4;
  }
  putchar(10);
  printf("On0   ");
  paiVar7 = PatCount[0] + 1;
  for (lVar6 = 0; lVar6 < p->vCis->nSize; lVar6 = lVar6 + 1) {
    printf("%3d ",(ulong)(uint)(*paiVar7)[0]);
    paiVar7 = paiVar7 + 2;
  }
  putchar(10);
  printf("On1   ");
  piVar8 = PatCount[0][1] + 1;
  for (lVar6 = 0; lVar6 < p->vCis->nSize; lVar6 = lVar6 + 1) {
    printf("%3d ",(ulong)(uint)*piVar8);
    piVar8 = piVar8 + 4;
  }
  putchar(10);
  putchar(10);
  printf("Diff  ");
  paiVar9 = Count[0];
  for (lVar6 = 0; lVar6 < p->vCis->nSize; lVar6 = lVar6 + 1) {
    printf("%3d ",(ulong)(uint)DiffCount[lVar6]);
  }
  putchar(10);
  putchar(10);
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    printf("      ");
    for (iVar1 = 0; iVar1 < p->vCis->nSize; iVar1 = iVar1 + 1) {
      printf("%3c ",(ulong)(iVar1 + 0x61));
    }
    putchar(10);
    paiVar10 = paiVar9;
    for (lVar12 = 0; lVar12 < p->vCis->nSize; lVar12 = lVar12 + 1) {
      printf(" %c    ",(ulong)((int)lVar12 + 0x61));
      for (lVar13 = 0; lVar13 < p->vCis->nSize; lVar13 = lVar13 + 1) {
        if ((*(int (*) [64])*paiVar10)[lVar13] == 0) {
          printf("  . ");
        }
        else {
          printf("%3d ");
        }
      }
      putchar(10);
      paiVar10 = paiVar10 + 1;
    }
    putchar(10);
    paiVar9 = paiVar9 + 0x40;
  }
  return;
}

Assistant:

void Bmc_ComputeSimTest( Gia_Man_t * p )
{
    int i, v, w, Res, Bit, Bit2, nPats = 256;
    int Count[2][64][64] = {{{0}}};
    int PatCount[64][2][2] = {{{0}}};
    int DiffCount[64] = {0};
    Vec_Int_t * vPat = Vec_IntAlloc( Gia_ManCiNum(p) );
    Vec_Int_t * vPat2 = Vec_IntAlloc( Gia_ManCiNum(p) );
    Vec_WrdFreeP( &p->vSims );
    p->vSims = Vec_WrdStart( Gia_ManObjNum(p) );
    printf( "Number of patterns = %d.\n", nPats );
    for ( i = 0; i < nPats; i++ )
    {
        Vec_IntClear( vPat );
        for ( v = 0; v < Gia_ManCiNum(p); v++ )
            Vec_IntPush( vPat, rand() & 1 );

//        Vec_IntForEachEntry( vPat, Bit, v )
//            printf( "%d", Bit );
//        printf( "    " );

        Res = Bmc_ComputeSimDiff( p, vPat, vPat2 );
//        printf( "%d ", Res );

//        Vec_IntForEachEntry( vPat2, Bit, v )
//            printf( "%d", Bit );
//        printf( "\n" );

        Vec_IntForEachEntry( vPat, Bit, v )
            PatCount[v][Res][Bit]++;

        Vec_IntForEachEntry( vPat2, Bit, v )
        {
            if ( Bit )
                DiffCount[v]++;
            Vec_IntForEachEntryStart( vPat2, Bit2, w, v + 1 )
                if ( Bit && Bit2 )
                    Count[Res][v][w]++;
        }
    }
    Vec_IntFree( vPat );
    Vec_IntFree( vPat2 );
    Vec_WrdFreeP( &p->vSims );


    printf( "\n" );
    printf( "      " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3c ", 'a'+v );
    printf( "\n" );

    printf( "Off0  " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3d ", PatCount[v][0][0] );
    printf( "\n" );

    printf( "Off1  " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3d ", PatCount[v][0][1] );
    printf( "\n" );

    printf( "On0   " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3d ", PatCount[v][1][0] );
    printf( "\n" );

    printf( "On1   " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3d ", PatCount[v][1][1] );
    printf( "\n" );
    printf( "\n" );

    printf( "Diff  " );
    for ( v = 0; v < Gia_ManCiNum(p); v++ )
        printf( "%3d ", DiffCount[v] );
    printf( "\n" );
    printf( "\n" );

    for ( i = 0; i < 2; i++ )
    {
        printf( "      " );
        for ( v = 0; v < Gia_ManCiNum(p); v++ )
            printf( "%3c ", 'a'+v );
        printf( "\n" );

        for ( v = 0; v < Gia_ManCiNum(p); v++ )
        {
            printf( " %c    ", 'a'+v );
            for ( w = 0; w < Gia_ManCiNum(p); w++ )
            {
                if ( Count[i][v][w] )
                    printf( "%3d ", Count[i][v][w] );
                else
                    printf( "  . " );
            }
            printf( "\n" );
        }
        printf( "\n" );
    }
}